

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O0

void HistogramBuild(int xsize,int histo_bits,VP8LBackwardRefs *backward_refs,
                   VP8LHistogramSet *image_histo)

{
  PixOrCopy *p;
  uint32_t distance_modifier_arg0;
  int iVar1;
  uint32_t uVar2;
  PixOrCopy *in_RCX;
  VP8LHistogram *in_RDX;
  uint32_t in_ESI;
  uint32_t in_EDI;
  int ix;
  PixOrCopy *v;
  VP8LRefsCursor c;
  VP8LHistogram **histograms;
  int histo_xsize;
  int y;
  int x;
  PixOrCopy *local_48;
  PixOrCopyBlock *in_stack_ffffffffffffffc0;
  int iVar3;
  int iVar4;
  
  iVar4 = 0;
  iVar3 = 0;
  distance_modifier_arg0 = VP8LSubSampleSize(in_EDI,in_ESI);
  VP8LRefsCursorInit((VP8LRefsCursor *)&local_48,(VP8LBackwardRefs *)in_RDX);
  VP8LHistogramSetClear((VP8LHistogramSet *)in_stack_ffffffffffffffc0);
  while( true ) {
    iVar1 = VP8LRefsCursorOk((VP8LRefsCursor *)&local_48);
    p = local_48;
    if (iVar1 == 0) break;
    VP8LHistogramAddSinglePixOrCopy
              (in_RDX,in_RCX,(_func_int_int_int *)CONCAT44(iVar4,iVar3),distance_modifier_arg0);
    uVar2 = PixOrCopyLength(p);
    for (iVar4 = uVar2 + iVar4; (int)in_EDI <= iVar4; iVar4 = iVar4 - in_EDI) {
      iVar3 = iVar3 + 1;
    }
    VP8LRefsCursorNext((VP8LRefsCursor *)0x18b5fb);
  }
  return;
}

Assistant:

static void HistogramBuild(
    int xsize, int histo_bits, const VP8LBackwardRefs* const backward_refs,
    VP8LHistogramSet* const image_histo) {
  int x = 0, y = 0;
  const int histo_xsize = VP8LSubSampleSize(xsize, histo_bits);
  VP8LHistogram** const histograms = image_histo->histograms;
  VP8LRefsCursor c = VP8LRefsCursorInit(backward_refs);
  assert(histo_bits > 0);
  VP8LHistogramSetClear(image_histo);
  while (VP8LRefsCursorOk(&c)) {
    const PixOrCopy* const v = c.cur_pos;
    const int ix = (y >> histo_bits) * histo_xsize + (x >> histo_bits);
    VP8LHistogramAddSinglePixOrCopy(histograms[ix], v, NULL, 0);
    x += PixOrCopyLength(v);
    while (x >= xsize) {
      x -= xsize;
      ++y;
    }
    VP8LRefsCursorNext(&c);
  }
}